

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.h
# Opt level: O1

void __thiscall
TPZSYsmpMatrix<long_double>::CopyFrom(TPZSYsmpMatrix<long_double> *this,TPZMatrix<long_double> *mat)

{
  TPZSYsmpMatrix<long_double> *copy;
  
  if (mat == (TPZMatrix<long_double> *)0x0) {
    copy = (TPZSYsmpMatrix<long_double> *)0x0;
  }
  else {
    copy = (TPZSYsmpMatrix<long_double> *)
           __dynamic_cast(mat,&TPZMatrix<long_double>::typeinfo,&typeinfo,0);
  }
  if (copy != (TPZSYsmpMatrix<long_double> *)0x0) {
    operator=(this,copy);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZSYsmpMatrix<long double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double]"
             ,0x60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsysmp.h",
             0x37);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSYsmpMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }